

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId S2CellId::FromFaceIJWrap(int face,int i,int j)

{
  int face_00;
  int i_00;
  int j_00;
  int *piVar1;
  double *pdVar2;
  S2CellId SVar3;
  S2Point local_70;
  double local_58;
  double local_50;
  double local_48;
  double v;
  double local_38;
  double local_30;
  double u;
  int local_20;
  int local_1c;
  int local_18;
  int j_local;
  int i_local;
  int face_local;
  
  local_20 = -1;
  local_1c = j;
  local_18 = i;
  j_local = face;
  piVar1 = std::min<int>(&kMaxSize,&local_18);
  piVar1 = std::max<int>(&local_20,piVar1);
  local_18 = *piVar1;
  u._4_4_ = 0xffffffff;
  piVar1 = std::min<int>(&kMaxSize,&local_1c);
  piVar1 = std::max<int>((int *)((long)&u + 4),piVar1);
  local_1c = *piVar1;
  local_38 = -1.0000000000000002;
  v = (double)((local_18 + -0x20000000) * 2 + 1) * 9.313225746154785e-10;
  pdVar2 = std::min<double>(&FromFaceIJWrap::kLimit,&v);
  pdVar2 = std::max<double>(&local_38,pdVar2);
  local_30 = *pdVar2;
  local_50 = -1.0000000000000002;
  local_58 = (double)((local_1c + -0x20000000) * 2 + 1) * 9.313225746154785e-10;
  pdVar2 = std::min<double>(&FromFaceIJWrap::kLimit,&local_58);
  pdVar2 = std::max<double>(&local_50,pdVar2);
  local_48 = *pdVar2;
  S2::FaceUVtoXYZ(&local_70,j_local,local_30,local_48);
  face_00 = S2::XYZtoFaceUV(&local_70,&local_30,&local_48);
  j_local = face_00;
  i_00 = S2::STtoIJ((local_30 + 1.0) * 0.5);
  j_00 = S2::STtoIJ((local_48 + 1.0) * 0.5);
  SVar3 = FromFaceIJ(face_00,i_00,j_00);
  return (S2CellId)SVar3.id_;
}

Assistant:

S2CellId S2CellId::FromFaceIJWrap(int face, int i, int j) {
  // Convert i and j to the coordinates of a leaf cell just beyond the
  // boundary of this face.  This prevents 32-bit overflow in the case
  // of finding the neighbors of a face cell.
  i = max(-1, min(kMaxSize, i));
  j = max(-1, min(kMaxSize, j));

  // We want to wrap these coordinates onto the appropriate adjacent face.
  // The easiest way to do this is to convert the (i,j) coordinates to (x,y,z)
  // (which yields a point outside the normal face boundary), and then call
  // S2::XYZtoFaceUV() to project back onto the correct face.
  //
  // The code below converts (i,j) to (si,ti), and then (si,ti) to (u,v) using
  // the linear projection (u=2*s-1 and v=2*t-1).  (The code further below
  // converts back using the inverse projection, s=0.5*(u+1) and t=0.5*(v+1).
  // Any projection would work here, so we use the simplest.)  We also clamp
  // the (u,v) coordinates so that the point is barely outside the
  // [-1,1]x[-1,1] face rectangle, since otherwise the reprojection step
  // (which divides by the new z coordinate) might change the other
  // coordinates enough so that we end up in the wrong leaf cell.
  static const double kScale = 1.0 / kMaxSize;
  static const double kLimit = 1.0 + DBL_EPSILON;
  // The arithmetic below is designed to avoid 32-bit integer overflows.
  S2_DCHECK_EQ(0, kMaxSize % 2);
  double u = max(-kLimit, min(kLimit, kScale * (2 * (i - kMaxSize / 2) + 1)));
  double v = max(-kLimit, min(kLimit, kScale * (2 * (j - kMaxSize / 2) + 1)));

  // Find the leaf cell coordinates on the adjacent face, and convert
  // them to a cell id at the appropriate level.
  face = S2::XYZtoFaceUV(S2::FaceUVtoXYZ(face, u, v), &u, &v);
  return FromFaceIJ(face, S2::STtoIJ(0.5*(u+1)), S2::STtoIJ(0.5*(v+1)));
}